

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall
inja::IfStatementNode::IfStatementNode(IfStatementNode *this,BlockNode *parent,size_t pos)

{
  size_t pos_local;
  BlockNode *parent_local;
  IfStatementNode *this_local;
  
  StatementNode::StatementNode(&this->super_StatementNode,pos);
  (this->super_StatementNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0024d628;
  ExpressionListNode::ExpressionListNode(&this->condition);
  BlockNode::BlockNode(&this->true_statement);
  BlockNode::BlockNode(&this->false_statement);
  this->parent = parent;
  this->is_nested = false;
  this->has_false_statement = false;
  return;
}

Assistant:

explicit IfStatementNode(BlockNode* const parent, size_t pos): StatementNode(pos), parent(parent), is_nested(false) {}